

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_regtest.c
# Opt level: O0

ErrorNumber test_with_simulator(void)

{
  ErrorNumber retValue;
  ErrorNumber local_4;
  
  local_4 = allocLib();
  if (((local_4 == TA_TEST_PASS) && (local_4 = testTAFunction_ALL(), local_4 == TA_TEST_PASS)) &&
     (local_4 = freeLib(), local_4 == TA_TEST_PASS)) {
    local_4 = TA_TEST_PASS;
  }
  return local_4;
}

Assistant:

static ErrorNumber test_with_simulator( void )
{
   ErrorNumber retValue;

   /* Initialize the library. */
   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Perform testing of each of the TA Functions. */
   retValue = testTAFunction_ALL();
   if( retValue != TA_TEST_PASS )
   {
      return retValue;
   }

   /* Clean-up and exit. */

   retValue = freeLib( );
   if( retValue != TA_TEST_PASS )
      return retValue;

   return TA_TEST_PASS; /* All test succeed. */
}